

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgvalfmt.c
# Opt level: O0

int mpt_msgvalfmt_code(int type)

{
  int local_c;
  int type_local;
  
  switch(type) {
  case 0x62:
    local_c = 0xe0;
    break;
  default:
    local_c = -1;
    break;
  case 100:
    local_c = 199;
    break;
  case 0x66:
    local_c = 0xc3;
    break;
  case 0x69:
    local_c = 0xe3;
    break;
  case 0x6e:
    local_c = 0xe1;
    break;
  case 0x71:
    local_c = 0xa1;
    break;
  case 0x74:
    local_c = 0xa7;
    break;
  case 0x75:
    local_c = 0xa3;
    break;
  case 0x78:
    local_c = 0xe7;
    break;
  case 0x79:
    local_c = 0xa0;
  }
  return local_c;
}

Assistant:

extern int mpt_msgvalfmt_code(int type)
{
	switch (type) {
#ifdef _MPT_FLOAT_EXTENDED_H
	    case 'e': return MPT_message_value(Float, long double);
#endif
	    case 'd': return MPT_message_value(Float, double);
	    case 'f': return MPT_message_value(Float, float);
	    
	    case 'b': return MPT_message_value(Integer, int8_t);
	    case 'n': return MPT_message_value(Integer, int16_t);
	    case 'i': return MPT_message_value(Integer, int32_t);
	    case 'x': return MPT_message_value(Integer, int64_t);
	    
	    case 'y': return MPT_message_value(Unsigned, uint8_t);
	    case 'q': return MPT_message_value(Unsigned, uint16_t);
	    case 'u': return MPT_message_value(Unsigned, uint32_t);
	    case 't': return MPT_message_value(Unsigned, uint64_t);
	    
	    default:  return -1;
	}
}